

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEvalRangePredicate(xmlXPathParserContextPtr ctxt)

{
  int *piVar1;
  xmlChar *pxVar2;
  int iVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlLocationSetPtr val;
  xmlXPathObjectPtr res_00;
  xmlXPathObjectPtr val_00;
  bool bVar6;
  int local_44;
  int i;
  xmlLocationSetPtr oldset;
  xmlLocationSetPtr newset;
  xmlXPathObjectPtr tmp;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr res;
  xmlChar *cur;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    while( true ) {
      bVar6 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar6 = true, 10 < *ctxt->cur)))) {
        bVar6 = *ctxt->cur == '\r';
      }
      if (!bVar6) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    if (*ctxt->cur == '[') {
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      while( true ) {
        bVar6 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar6 = true, 10 < *ctxt->cur)))) {
          bVar6 = *ctxt->cur == '\r';
        }
        if (!bVar6) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_LOCATIONSET)) {
        xmlXPathErr(ctxt,0xb);
      }
      else {
        pxVar4 = valuePop(ctxt);
        piVar1 = (int *)pxVar4->user;
        ctxt->context->node = (xmlNodePtr)0x0;
        if ((piVar1 == (int *)0x0) || (*piVar1 == 0)) {
          ctxt->context->contextSize = 0;
          ctxt->context->proximityPosition = 0;
          xmlXPathEvalExpr(ctxt);
          pxVar5 = valuePop(ctxt);
          if (pxVar5 != (xmlXPathObjectPtr)0x0) {
            xmlXPathFreeObject(pxVar5);
          }
          valuePush(ctxt,pxVar4);
          if (ctxt->error != 0) {
            return;
          }
        }
        else {
          pxVar2 = ctxt->cur;
          val = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
          for (local_44 = 0; local_44 < *piVar1; local_44 = local_44 + 1) {
            ctxt->cur = pxVar2;
            ctxt->context->node =
                 *(xmlNodePtr *)(*(long *)(*(long *)(piVar1 + 2) + (long)local_44 * 8) + 0x28);
            pxVar5 = xmlXPathNewNodeSet(ctxt->context->node);
            valuePush(ctxt,pxVar5);
            ctxt->context->contextSize = *piVar1;
            ctxt->context->proximityPosition = local_44 + 1;
            xmlXPathEvalExpr(ctxt);
            if (ctxt->error != 0) {
              return;
            }
            res_00 = valuePop(ctxt);
            iVar3 = xmlXPathEvaluatePredicateResult(ctxt,res_00);
            if (iVar3 != 0) {
              val_00 = xmlXPathObjectCopy(*(xmlXPathObjectPtr *)
                                           (*(long *)(piVar1 + 2) + (long)local_44 * 8));
              xmlXPtrLocationSetAdd(val,val_00);
            }
            if (res_00 != (xmlXPathObjectPtr)0x0) {
              xmlXPathFreeObject(res_00);
            }
            if (ctxt->value == pxVar5) {
              pxVar5 = valuePop(ctxt);
              xmlXPathFreeObject(pxVar5);
            }
            ctxt->context->node = (xmlNodePtr)0x0;
          }
          xmlXPathFreeObject(pxVar4);
          ctxt->context->node = (xmlNodePtr)0x0;
          ctxt->context->contextSize = -1;
          ctxt->context->proximityPosition = -1;
          pxVar4 = xmlXPtrWrapLocationSet(val);
          valuePush(ctxt,pxVar4);
        }
        if (*ctxt->cur == ']') {
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          while( true ) {
            bVar6 = true;
            if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar6 = true, 10 < *ctxt->cur)))) {
              bVar6 = *ctxt->cur == '\r';
            }
            if (!bVar6) break;
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
          }
        }
        else {
          xmlXPathErr(ctxt,6);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,6);
    }
  }
  return;
}

Assistant:

void
xmlXPtrEvalRangePredicate(xmlXPathParserContextPtr ctxt) {
    const xmlChar *cur;
    xmlXPathObjectPtr res;
    xmlXPathObjectPtr obj, tmp;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset;
    int i;

    if (ctxt == NULL) return;

    SKIP_BLANKS;
    if (CUR != '[') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }
    NEXT;
    SKIP_BLANKS;

    /*
     * Extract the old set, and then evaluate the result of the
     * expression for all the element in the set. use it to grow
     * up a new set.
     */
    CHECK_TYPE(XPATH_LOCATIONSET);
    obj = valuePop(ctxt);
    oldset = obj->user;
    ctxt->context->node = NULL;

    if ((oldset == NULL) || (oldset->locNr == 0)) {
	ctxt->context->contextSize = 0;
	ctxt->context->proximityPosition = 0;
	xmlXPathEvalExpr(ctxt);
	res = valuePop(ctxt);
	if (res != NULL)
	    xmlXPathFreeObject(res);
	valuePush(ctxt, obj);
	CHECK_ERROR;
    } else {
	/*
	 * Save the expression pointer since we will have to evaluate
	 * it multiple times. Initialize the new set.
	 */
        cur = ctxt->cur;
	newset = xmlXPtrLocationSetCreate(NULL);

        for (i = 0; i < oldset->locNr; i++) {
	    ctxt->cur = cur;

	    /*
	     * Run the evaluation with a node list made of a single item
	     * in the nodeset.
	     */
	    ctxt->context->node = oldset->locTab[i]->user;
	    tmp = xmlXPathNewNodeSet(ctxt->context->node);
	    valuePush(ctxt, tmp);
	    ctxt->context->contextSize = oldset->locNr;
	    ctxt->context->proximityPosition = i + 1;

	    xmlXPathEvalExpr(ctxt);
	    CHECK_ERROR;

	    /*
	     * The result of the evaluation need to be tested to
	     * decided whether the filter succeeded or not
	     */
	    res = valuePop(ctxt);
	    if (xmlXPathEvaluatePredicateResult(ctxt, res)) {
	        xmlXPtrLocationSetAdd(newset,
			xmlXPathObjectCopy(oldset->locTab[i]));
	    }

	    /*
	     * Cleanup
	     */
	    if (res != NULL)
		xmlXPathFreeObject(res);
	    if (ctxt->value == tmp) {
		res = valuePop(ctxt);
		xmlXPathFreeObject(res);
	    }

	    ctxt->context->node = NULL;
	}

	/*
	 * The result is used as the new evaluation set.
	 */
	xmlXPathFreeObject(obj);
	ctxt->context->node = NULL;
	ctxt->context->contextSize = -1;
	ctxt->context->proximityPosition = -1;
	valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    }
    if (CUR != ']') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }

    NEXT;
    SKIP_BLANKS;
}